

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

int read_binary_data(T1_Parser parser,FT_ULong *size,FT_Byte **base,FT_Bool incremental)

{
  byte *pbVar1;
  byte *pbVar2;
  bool bVar3;
  FT_ULong FVar4;
  FT_Byte *pFVar5;
  
  pbVar1 = (parser->root).limit;
  (*(parser->root).funcs.skip_spaces)(&parser->root);
  pbVar2 = (parser->root).cursor;
  if ((pbVar2 < pbVar1) && (*pbVar2 - 0x30 < 10)) {
    FVar4 = (*(parser->root).funcs.to_int)(&parser->root);
    (*(parser->root).funcs.skip_PS_token)(&parser->root);
    pFVar5 = (parser->root).cursor + 1;
    *base = pFVar5;
    bVar3 = (long)FVar4 < (long)pbVar1 - (long)pFVar5;
    if (bVar3 && -1 < (long)FVar4) {
      (parser->root).cursor = (parser->root).cursor + FVar4 + 1;
      *size = FVar4;
      pFVar5 = (FT_Byte *)(ulong)((parser->root).error == 0);
    }
    if (bVar3 && -1 < (long)FVar4) {
      return (int)pFVar5;
    }
  }
  if (incremental == '\0') {
    (parser->root).error = 3;
  }
  return 0;
}

Assistant:

static int
  read_binary_data( T1_Parser  parser,
                    FT_ULong*  size,
                    FT_Byte**  base,
                    FT_Bool    incremental )
  {
    FT_Byte*  cur;
    FT_Byte*  limit = parser->root.limit;


    /* the binary data has one of the following formats */
    /*                                                  */
    /*   `size' [white*] RD white ....... ND            */
    /*   `size' [white*] -| white ....... |-            */
    /*                                                  */

    T1_Skip_Spaces( parser );

    cur = parser->root.cursor;

    if ( cur < limit && ft_isdigit( *cur ) )
    {
      FT_Long  s = T1_ToInt( parser );


      T1_Skip_PS_Token( parser );   /* `RD' or `-|' or something else */

      /* there is only one whitespace char after the */
      /* `RD' or `-|' token                          */
      *base = parser->root.cursor + 1;

      if ( s >= 0 && s < limit - *base )
      {
        parser->root.cursor += s + 1;
        *size = (FT_ULong)s;
        return !parser->root.error;
      }
    }

    if( !incremental )
    {
      FT_ERROR(( "read_binary_data: invalid size field\n" ));
      parser->root.error = FT_THROW( Invalid_File_Format );
    }

    return 0;
  }